

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# newtonmin.c
# Opt level: O0

int hessian_fd(custom_function *funcpt,double *x,int N,double *dx,double eps,double *f)

{
  double *__ptr;
  double *__ptr_00;
  double *__ptr_01;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double *xij;
  double *xj;
  double *xi;
  double stepmax;
  double fd;
  double stepj;
  double stepi;
  int local_48;
  int retval;
  int j;
  int i;
  double *f_local;
  double eps_local;
  double *dx_local;
  int N_local;
  double *x_local;
  custom_function *funcpt_local;
  
  dVar1 = pow(eps,0.3333333333333333);
  __ptr = (double *)malloc((long)N << 3);
  __ptr_00 = (double *)malloc((long)N << 3);
  __ptr_01 = (double *)malloc((long)N << 3);
  retval = 0;
  do {
    if (N <= retval) {
      free(__ptr);
      free(__ptr_00);
      free(__ptr_01);
      return 0;
    }
    if (ABS(x[retval]) < 1.0 / ABS(dx[retval])) {
      dVar2 = signx(x[retval]);
      xi = (double *)((dVar2 * 1.0) / ABS(dx[retval]));
    }
    else {
      xi = (double *)x[retval];
    }
    dVar2 = dVar1 * (double)xi;
    for (local_48 = 0; local_48 < N; local_48 = local_48 + 1) {
      __ptr[local_48] = x[local_48];
      __ptr_00[local_48] = x[local_48];
      __ptr_01[local_48] = x[local_48];
    }
    __ptr[retval] = dVar2 + __ptr[retval];
    __ptr_01[retval] = dVar2 + __ptr_01[retval];
    for (local_48 = 0; local_48 < N; local_48 = local_48 + 1) {
      if (ABS(x[local_48]) < 1.0 / ABS(dx[local_48])) {
        dVar3 = signx(x[local_48]);
        xi = (double *)((dVar3 * 1.0) / ABS(dx[local_48]));
      }
      else {
        xi = (double *)x[local_48];
      }
      dVar3 = dVar1 * (double)xi;
      __ptr_00[local_48] = dVar3 + __ptr_00[local_48];
      __ptr_01[local_48] = dVar3 + __ptr_01[local_48];
      dVar4 = (*funcpt->funcpt)(__ptr_01,N,funcpt->params);
      dVar5 = (*funcpt->funcpt)(__ptr,N,funcpt->params);
      dVar6 = (*funcpt->funcpt)(__ptr_00,N,funcpt->params);
      dVar7 = (*funcpt->funcpt)(x,N,funcpt->params);
      f[retval * N + local_48] = ((dVar4 - dVar5) - (dVar6 - dVar7)) / (dVar2 * dVar3);
      if ((1.79769313486232e+308 <= f[retval * N + local_48]) ||
         (f[retval * N + local_48] <= -1.79769313486232e+308)) {
        printf("Program Exiting as the function value exceeds the maximum double value");
        free(__ptr);
        free(__ptr_00);
        free(__ptr_01);
        return 0xf;
      }
      if ((f[retval * N + local_48] != f[retval * N + local_48]) ||
         (NAN(f[retval * N + local_48]) || NAN(f[retval * N + local_48]))) {
        printf("Program Exiting as the function returns NaN");
        free(__ptr);
        free(__ptr_00);
        free(__ptr_01);
        return 0xf;
      }
      __ptr_00[local_48] = __ptr_00[local_48] - dVar3;
      __ptr_01[local_48] = __ptr_01[local_48] - dVar3;
    }
    retval = retval + 1;
  } while( true );
}

Assistant:

int hessian_fd(custom_function *funcpt,double *x,int N,double *dx,double eps,double *f) {
	int i,j,retval;
	double stepi,stepj,fd,stepmax;
	double *xi,*xj,*xij;
	
	retval = 0;

	fd = pow((double) eps,1.0/3.0);
	xi = (double*) malloc(sizeof(double) *N);
	xj = (double*) malloc(sizeof(double) *N);
	xij = (double*) malloc(sizeof(double) *N);
	
	for(i = 0; i < N;++i) {
		if (fabs(x[i]) >= 1.0 / fabs(dx[i])) {
			stepmax = x[i];
		} else {
			stepmax = signx(x[i]) * 1.0 / fabs(dx[i]);
		}
		stepi = fd * stepmax;
		for(j = 0; j < N;++j) {
			xi[j] = x[j];
			xj[j]= x[j];
			xij[j] = x[j];
		}
		xi[i] += stepi;
		xij[i] += stepi;
		for(j = 0; j < N;++j) {
			if (fabs(x[j]) >= 1.0 / fabs(dx[j])) {
				stepmax = x[j];
			} else {
				stepmax = signx(x[j]) * 1.0 / fabs(dx[j]);
			}
			stepj = fd * stepmax;
			xj[j] += stepj;
			xij[j] += stepj;

			f[i*N+j] = ((FUNCPT_EVAL(funcpt,xij,N) - FUNCPT_EVAL(funcpt,xi,N)) - (FUNCPT_EVAL(funcpt,xj,N) - FUNCPT_EVAL(funcpt,x,N)))/(stepi * stepj);
			if (f[i*N+j] >= DBL_MAX || f[i*N+j] <= -DBL_MAX) {
				printf("Program Exiting as the function value exceeds the maximum double value");
				free(xi);
				free(xj);
				free(xij);
				return 15;
			}
			if (f[i*N+j] != f[i*N+j]) {
				printf("Program Exiting as the function returns NaN");
				free(xi);
				free(xj);
				free(xij);
				return 15;
			}
			xj[j] -= stepj;
			xij[j] -= stepj;
		}

	}
	
	free(xi);
	free(xj);
	free(xij);
	return retval;
	
}